

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

int anon_unknown.dwarf_15077d::cmFileUploadProgressCallback
              (void *clientp,double dltotal,double dlnow,double ultotal,double ulnow)

{
  bool bVar1;
  cmCommand *this;
  cmMakefile *this_00;
  char *message;
  cmMakefile *mf;
  cmFileCommand *fc;
  undefined1 local_58 [8];
  string status;
  cURLProgressHelper *helper;
  double ulnow_local;
  double ultotal_local;
  double dlnow_local;
  double dltotal_local;
  void *clientp_local;
  
  status.field_2._8_8_ = clientp;
  std::__cxx11::string::string((string *)local_58);
  bVar1 = cURLProgressHelper::UpdatePercentage
                    ((cURLProgressHelper *)status.field_2._8_8_,ulnow,ultotal,(string *)local_58);
  if (bVar1) {
    this = &cURLProgressHelper::GetFileCommand((cURLProgressHelper *)status.field_2._8_8_)->
            super_cmCommand;
    this_00 = cmCommand::GetMakefile(this);
    message = (char *)std::__cxx11::string::c_str();
    cmMakefile::DisplayStatus(this_00,message,-1.0);
  }
  std::__cxx11::string::~string((string *)local_58);
  return 0;
}

Assistant:

static int
  cmFileUploadProgressCallback(void *clientp,
                               double dltotal, double dlnow,
                               double ultotal, double ulnow)
    {
    cURLProgressHelper *helper =
    reinterpret_cast<cURLProgressHelper *>(clientp);

    static_cast<void>(dltotal);
    static_cast<void>(dlnow);

    std::string status;
    if (helper->UpdatePercentage(ulnow, ultotal, status))
      {
      cmFileCommand *fc = helper->GetFileCommand();
      cmMakefile *mf = fc->GetMakefile();
      mf->DisplayStatus(status.c_str(), -1);
      }

    return 0;
    }